

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_short_radix(char *str,int n,void *dest,int radix)

{
  bool bVar1;
  long local_38;
  long r;
  short *psStack_28;
  int radix_local;
  void *dest_local;
  char *pcStack_18;
  int n_local;
  char *str_local;
  
  r._4_4_ = radix;
  psStack_28 = (short *)dest;
  dest_local._4_4_ = n;
  pcStack_18 = str;
  bVar1 = parse_long_radix(str,n,&local_38,radix);
  if (bVar1) {
    if ((short)local_38 == local_38) {
      if (psStack_28 == (short *)0x0) {
        str_local._7_1_ = true;
      }
      else {
        *psStack_28 = (short)local_38;
        str_local._7_1_ = true;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool RE2::Arg::parse_short_radix(const char* str,
                                int n,
                                void* dest,
                                int radix) {
  long r;
  if (!parse_long_radix(str, n, &r, radix)) return false; // Could not parse
  if ((short)r != r) return false;       // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<short*>(dest)) = (short)r;
  return true;
}